

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_parse_template_part(JSParseState *s,uint8_t *p)

{
  byte *pbVar1;
  int iVar2;
  byte *in_RSI;
  JSParseState *in_RDI;
  JSValue JVar3;
  uint8_t *p_next;
  StringBuffer *b;
  StringBuffer b_s;
  uint32_t c;
  StringBuffer *in_stack_ffffffffffffff98;
  JSParseState *pJVar4;
  JSContext *in_stack_ffffffffffffffa0;
  int64_t local_58;
  byte *local_50;
  undefined1 *local_48;
  undefined1 local_40 [36];
  uint local_1c;
  byte *local_18;
  JSParseState *local_10;
  
  local_48 = local_40;
  local_18 = in_RSI;
  local_10 = in_RDI;
  iVar2 = string_buffer_init(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0);
  pbVar1 = local_18;
  pJVar4 = local_10;
  do {
    local_18 = pbVar1;
    if (iVar2 != 0) {
LAB_0018ca5f:
      string_buffer_free((StringBuffer *)0x18ca69);
      return -1;
    }
    local_10 = pJVar4;
    if (pJVar4->buf_end <= pbVar1) {
LAB_0018ca4c:
      js_parse_error(local_10,"unexpected end of string");
      goto LAB_0018ca5f;
    }
    local_18 = pbVar1 + 1;
    local_1c = (uint)*pbVar1;
    if (local_1c == 0x60) {
LAB_0018c9e6:
      (pJVar4->token).val = -0x7e;
      *(uint *)((long)&(pJVar4->token).u + 0x10) = local_1c;
      JVar3 = string_buffer_end((StringBuffer *)in_stack_ffffffffffffffa0);
      (pJVar4->token).u.str.str.u = JVar3.u;
      local_58 = JVar3.tag;
      (pJVar4->token).u.str.str.tag = local_58;
      local_10->buf_ptr = local_18;
      return 0;
    }
    if ((local_1c == 0x24) && (*local_18 == 0x7b)) {
      local_18 = pbVar1 + 2;
      goto LAB_0018c9e6;
    }
    if (local_1c == 0x5c) {
      iVar2 = string_buffer_putc8(in_stack_ffffffffffffff98,0);
      if (iVar2 != 0) goto LAB_0018ca5f;
      if (local_10->buf_end <= local_18) goto LAB_0018ca4c;
      local_1c = (uint)*local_18;
      local_18 = local_18 + 1;
    }
    if (local_1c == 0xd) {
      if (*local_18 == 10) {
        local_18 = local_18 + 1;
      }
      local_1c = 10;
    }
    if (local_1c == 10) {
      local_10->line_num = local_10->line_num + 1;
    }
    else if (0x7f < local_1c) {
      local_1c = unicode_from_utf8(local_18 + -1,6,&local_50);
      if (0x10ffff < local_1c) {
        js_parse_error(local_10,"invalid UTF-8 sequence");
        goto LAB_0018ca5f;
      }
      local_18 = local_50;
    }
    iVar2 = string_buffer_putc(in_stack_ffffffffffffff98,0);
    pbVar1 = local_18;
    pJVar4 = local_10;
  } while( true );
}

Assistant:

static __exception int js_parse_template_part(JSParseState *s, const uint8_t *p)
{
    uint32_t c;
    StringBuffer b_s, *b = &b_s;

    /* p points to the first byte of the template part */
    if (string_buffer_init(s->ctx, b, 32))
        goto fail;
    for(;;) {
        if (p >= s->buf_end)
            goto unexpected_eof;
        c = *p++;
        if (c == '`') {
            /* template end part */
            break;
        }
        if (c == '$' && *p == '{') {
            /* template start or middle part */
            p++;
            break;
        }
        if (c == '\\') {
            if (string_buffer_putc8(b, c))
                goto fail;
            if (p >= s->buf_end)
                goto unexpected_eof;
            c = *p++;
        }
        /* newline sequences are normalized as single '\n' bytes */
        if (c == '\r') {
            if (*p == '\n')
                p++;
            c = '\n';
        }
        if (c == '\n') {
            s->line_num++;
        } else if (c >= 0x80) {
            const uint8_t *p_next;
            c = unicode_from_utf8(p - 1, UTF8_CHAR_LEN_MAX, &p_next);
            if (c > 0x10FFFF) {
                js_parse_error(s, "invalid UTF-8 sequence");
                goto fail;
            }
            p = p_next;
        }
        if (string_buffer_putc(b, c))
            goto fail;
    }
    s->token.val = TOK_TEMPLATE;
    s->token.u.str.sep = c;
    s->token.u.str.str = string_buffer_end(b);
    s->buf_ptr = p;
    return 0;

 unexpected_eof:
    js_parse_error(s, "unexpected end of string");
 fail:
    string_buffer_free(b);
    return -1;
}